

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeglobals.cpp
# Opt level: O0

QString * __thiscall QMakeGlobals::getEnv(QMakeGlobals *this,QString *var)

{
  QString *in_RDI;
  long in_FS_OFFSET;
  QString local_38;
  char local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QString::toLocal8Bit(&local_38);
  QByteArray::constData((QByteArray *)0x30c270);
  qgetenv(local_20);
  QString::fromLocal8Bit<void>((QByteArray *)in_RDI);
  QByteArray::~QByteArray((QByteArray *)0x30c29b);
  QByteArray::~QByteArray((QByteArray *)0x30c2a5);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QMakeGlobals::getEnv(const QString &var) const
{
#ifdef PROEVALUATOR_SETENV
    return environment.value(var);
#else
    return QString::fromLocal8Bit(qgetenv(var.toLocal8Bit().constData()));
#endif
}